

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

bool __thiscall S1Interval::Intersects(S1Interval *this,S1Interval *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  
  dVar1 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if ((((dVar1 != 3.141592653589793) || (NAN(dVar1))) || (dVar2 != -3.141592653589793)) ||
     (NAN(dVar2))) {
    dVar3 = (y->bounds_).c_[0];
    dVar4 = (y->bounds_).c_[1];
    if (((dVar3 != 3.141592653589793) || (NAN(dVar3))) ||
       ((dVar4 != -3.141592653589793 || (NAN(dVar4))))) {
      if (dVar2 < dVar1) {
        bVar5 = dVar1 <= dVar4 | -(dVar3 <= dVar2) | -(dVar4 < dVar3);
        goto LAB_0019dcd6;
      }
      if (dVar3 <= dVar4) {
        if (dVar2 < dVar3) goto LAB_0019dcd4;
      }
      else {
        bVar5 = 1;
        if (dVar3 <= dVar2) goto LAB_0019dcd6;
      }
      bVar5 = dVar1 <= dVar4;
      goto LAB_0019dcd6;
    }
  }
LAB_0019dcd4:
  bVar5 = 0;
LAB_0019dcd6:
  return (bool)(bVar5 & 1);
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }